

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_unittest.cc
# Opt level: O2

AssertionResult __thiscall
anon_unknown.dwarf_3c01d::IsEqual
          (anon_unknown_dwarf_3c01d *this,char *test_data,uint32_t digest,char *test_result)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  AssertionResult *pAVar4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar5;
  char *test_result_local;
  char *test_data_local;
  string output;
  AssertionResult local_198 [23];
  
  test_result_local = test_result;
  test_data_local = test_data;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  poVar3 = std::operator<<(local_198,0x30);
  lVar1 = *(long *)poVar3;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x10) = 8;
  *(uint *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x18) | 0x200;
  *(uint *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  iVar2 = strcmp(output._M_dataplus._M_p,test_result);
  if (iVar2 == 0) {
    testing::AssertionSuccess();
  }
  else {
    testing::AssertionFailure();
    pAVar4 = testing::AssertionResult::operator<<(local_198,(char (*) [10])"hash of \"");
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,&test_data_local);
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,(char (*) [14])"\" incorrect:\n");
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,(char (*) [2])"\t");
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,&output);
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,(char (*) [11])" returned\n");
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,(char (*) [2])"\t");
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,&test_result_local);
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,(char (*) [13])" is correct\n");
    testing::AssertionResult::AssertionResult((AssertionResult *)this,pAVar4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&local_198[0].message_);
  }
  std::__cxx11::string::~string((string *)&output);
  AVar5.message_.ptr_ = extraout_RDX.ptr_;
  AVar5._0_8_ = this;
  return AVar5;
}

Assistant:

::testing::AssertionResult IsEqual(const char *test_data,
                                   uint32_t digest,
                                   const char *test_result) {
  std::string output = digest_to_hex(digest);
  if (strcmp(output.c_str(), test_result) == 0) {
    return ::testing::AssertionSuccess();
  } else {
    return ::testing::AssertionFailure()
        << "hash of \"" << test_data << "\" incorrect:\n"
        << "\t" << output << " returned\n"
        << "\t" << test_result << " is correct\n";
  }
}